

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

void __thiscall Util::BlockShuffle(Util *this,array<int,_9UL> *vec)

{
  int iVar1;
  int j;
  long lVar2;
  int i;
  long lVar3;
  array<int,_3UL> block;
  array<int,_3UL> blocks;
  int local_50 [4];
  int local_40 [4];
  
  local_40[0] = 0;
  local_40[1] = 1;
  local_40[2] = 2;
  std::
  shuffle<int*,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>&>
            (local_40,local_40 + 3,&this->rng_);
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    local_50[0] = 0;
    local_50[1] = 1;
    local_50[2] = 2;
    std::
    shuffle<int*,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>&>
              (local_50,local_50 + 3,&this->rng_);
    iVar1 = local_40[lVar3];
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      *(int *)((long)vec + lVar2 * 4) = local_50[lVar2] + iVar1 * 3;
    }
    vec = (array<int,_9UL> *)((long)vec + 0xc);
  }
  return;
}

Assistant:

void Util::BlockShuffle(array<int, 9> *vec) {
    array<int, 3> blocks{0, 1, 2};
    shuffle(blocks.begin(), blocks.end(), rng_);
    for (int i = 0; i < 3; i++) {
        array<int, 3> block{0, 1, 2};
        shuffle(block.begin(), block.end(), rng_);
        for (int j = 0; j < 3; j++) {
            (*vec)[i * 3 + j] = blocks[i] * 3 + block[j];
        }
    }
}